

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeRefining.cpp
# Opt level: O2

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
anon_func::ReadUpdater::create(ReadUpdater *this)

{
  TypeRefining *parent;
  ReadUpdater *this_00;
  long in_RSI;
  
  parent = *(TypeRefining **)(in_RSI + 0x130);
  this_00 = (ReadUpdater *)operator_new(0x138);
  ::wasm::(anonymous_namespace)::TypeRefining::updateInstructions(wasm::Module&)::ReadUpdater::
  ReadUpdater(wasm::(anonymous)::TypeRefining__(this_00,parent);
  (this->super_WalkerPass<wasm::PostWalker<ReadUpdater,_wasm::Visitor<ReadUpdater,_void>_>_>).
  super_Pass._vptr_Pass = (_func_int **)this_00;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
        return std::make_unique<ReadUpdater>(parent);
      }